

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

int __thiscall rw::Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  FILE *__stream;
  long lVar1;
  char *pcVar2;
  undefined8 *puVar3;
  int iVar4;
  bool bVar5;
  Error _e;
  
  if ((engine == 0) && (state == 0)) {
    totalMemoryAllocated = 0;
    allocations = &allocations;
    _DAT_00145f38 = &allocations;
    if (this == (Engine *)0x0) {
      DAT_00145de0 = (code *)defaultMemfuncs._32_8_;
      DAT_00145dd0 = (LLLink *)defaultMemfuncs._16_8_;
      DAT_00145dd8 = (code *)defaultMemfuncs._24_8_;
      memfuncs._0_4_ = defaultMemfuncs._0_4_;
      memfuncs._4_4_ = defaultMemfuncs._4_4_;
      DAT_00145dc8._0_4_ = defaultMemfuncs._8_4_;
      DAT_00145dc8._4_4_ = defaultMemfuncs._12_4_;
    }
    else {
      DAT_00145de0 = (code *)this->driver[0];
      DAT_00145dd0 = (this->frameDirtyList).link.next;
      DAT_00145dd8 = (code *)(this->frameDirtyList).link.prev;
      memfuncs._0_4_ = *(undefined4 *)&this->currentCamera;
      memfuncs._4_4_ = *(undefined4 *)((long)&this->currentCamera + 4);
      DAT_00145dc8._0_4_ = *(undefined4 *)&this->currentWorld;
      DAT_00145dc8._4_4_ = *(undefined4 *)((long)&this->currentWorld + 4);
    }
    if ((LLLink *)DAT_00145dd8 == (LLLink *)0x0) {
      DAT_00145dd8 = mustmalloc_h;
    }
    if ((Driver *)DAT_00145de0 == (Driver *)0x0) {
      DAT_00145de0 = mustrealloc_h;
    }
    PluginList::open((char *)this,(int)ctx);
    lVar1 = 0xd;
    puVar3 = &DAT_00145df8;
    while (bVar5 = lVar1 != 0, lVar1 = lVar1 + -1, bVar5) {
      puVar3[-1] = 0x5800000058;
      *puVar3 = puVar3;
      puVar3[1] = puVar3;
      puVar3 = puVar3 + 3;
    }
    Frame::registerModule();
    Image::registerModule();
    Raster::registerModule();
    Texture::registerModule();
    Frame::numAllocated = 0;
    Image::numAllocated = 0;
    Raster::numAllocated = 0;
    Texture::numAllocated = 0;
    TexDictionary::numAllocated = 0;
    Geometry::numAllocated = 0;
    Material::numAllocated = 0;
    Atomic::numAllocated = 0;
    Light::numAllocated = 0;
    Camera::numAllocated = 0;
    Clump::numAllocated = 0;
    World::numAllocated = 0;
    ps2::registerPlatformPlugins();
    xbox::registerPlatformPlugins();
    d3d8::registerPlatformPlugins();
    d3d9::registerPlatformPlugins();
    wdgl::registerPlatformPlugins();
    gl3::registerPlatformPlugins();
    state = 1;
    iVar4 = 1;
  }
  else {
    _e.plugin = 0;
    _e.code = 0x80000007;
    iVar4 = 0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/engine.cpp"
            ,0xbe);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000007);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&_e);
  }
  return iVar4;
}

Assistant:

bool32
Engine::init(MemoryFunctions *memfuncs)
{
	if(engine || Engine::state != Dead){
		RWERROR((ERR_ENGINEINIT));
		return 0;
	}

	totalMemoryAllocated = 0;
	allocations.init();

	if(memfuncs)
		Engine::memfuncs = *memfuncs;
	else
		Engine::memfuncs = defaultMemfuncs;

	if(Engine::memfuncs.rwmustmalloc == nil)
		Engine::memfuncs.rwmustmalloc = mustmalloc_h;
	if(Engine::memfuncs.rwmustrealloc == nil)
		Engine::memfuncs.rwmustrealloc = mustrealloc_h;

	PluginList::open();

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		new (&Driver::s_plglist[i]) PluginList(sizeof(Driver));

	// core plugin attach here
	Frame::registerModule();
	Image::registerModule();
	Raster::registerModule();
	Texture::registerModule();

	// TODO: reset all allocation counts here. or maybe do that in modules?
	Frame::numAllocated = 0;
	Image::numAllocated = 0;
	Raster::numAllocated = 0;
	Texture::numAllocated = 0;
	TexDictionary::numAllocated = 0;
	Geometry::numAllocated = 0;
	Material::numAllocated = 0;
	Atomic::numAllocated = 0;
	Light::numAllocated = 0;
	Camera::numAllocated = 0;
	Clump::numAllocated = 0;
	World::numAllocated = 0;

	// driver plugin attach
	ps2::registerPlatformPlugins();
	xbox::registerPlatformPlugins();
	d3d8::registerPlatformPlugins();
	d3d9::registerPlatformPlugins();
	wdgl::registerPlatformPlugins();
	gl3::registerPlatformPlugins();

	Engine::state = Initialized;
	return 1;
}